

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

uint P_GetStackPortal(AActor *point,int plane)

{
  sector_t *psVar1;
  uint uVar2;
  FSectorPortal *pFVar3;
  AActor *pAVar4;
  uint i;
  int plane_local;
  AActor *point_local;
  
  uVar2 = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  memset(pFVar3,0,0x40);
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  pFVar3->mType = 1;
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  pFVar3->mPlane = plane;
  pAVar4 = TObjPtr<AActor>::operator->(&point->target);
  psVar1 = pAVar4->Sector;
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  pFVar3->mOrigin = psVar1;
  psVar1 = point->Sector;
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  pFVar3->mDestination = psVar1;
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  pFVar3->mPlaneZ = 3.4028234663852886e+38;
  pFVar3 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar2);
  TObjPtr<AActor>::operator=(&pFVar3->mSkybox,point);
  return uVar2;
}

Assistant:

unsigned P_GetStackPortal(AActor *point, int plane)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_STACKEDSECTORTHING;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = point->target->Sector;
	sectorPortals[i].mDestination = point->Sector;
	sectorPortals[i].mPlaneZ = FLT_MAX;
	sectorPortals[i].mSkybox = point;
	return i;
}